

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeCasts.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_168::BestCastFinder::handleRefinement(BestCastFinder *this,Expression *curr)

{
  Expression *pEVar1;
  
  pEVar1 = Properties::getFallthrough
                     (curr,&this->options,
                      (this->
                      super_LinearExecutionWalker<wasm::(anonymous_namespace)::BestCastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::BestCastFinder,_void>_>
                      ).
                      super_PostWalker<wasm::(anonymous_namespace)::BestCastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::BestCastFinder,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::BestCastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::BestCastFinder,_void>_>
                      .currModule,NoTeeBrIf);
  if (pEVar1->_id == LocalSetId) {
    updateBestCast(this,curr,*(Index *)(pEVar1 + 1));
  }
  pEVar1 = Properties::getFallthrough
                     (pEVar1,&this->options,
                      (this->
                      super_LinearExecutionWalker<wasm::(anonymous_namespace)::BestCastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::BestCastFinder,_void>_>
                      ).
                      super_PostWalker<wasm::(anonymous_namespace)::BestCastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::BestCastFinder,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::BestCastFinder,_wasm::Visitor<wasm::(anonymous_namespace)::BestCastFinder,_void>_>
                      .currModule,AllowTeeBrIf);
  if (pEVar1->_id == LocalGetId) {
    updateBestCast(this,curr,*(Index *)(pEVar1 + 1));
    return;
  }
  return;
}

Assistant:

void handleRefinement(Expression* curr) {
    auto* teeFallthrough = Properties::getFallthrough(
      curr, options, *getModule(), Properties::FallthroughBehavior::NoTeeBrIf);
    if (auto* tee = teeFallthrough->dynCast<LocalSet>()) {
      updateBestCast(curr, tee->index);
    }
    auto* fallthrough =
      Properties::getFallthrough(teeFallthrough, options, *getModule());
    if (auto* get = fallthrough->dynCast<LocalGet>()) {
      updateBestCast(curr, get->index);
    }
  }